

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.hpp
# Opt level: O3

void __thiscall
diy::detail::KDTreePartners::KDTreePartners
          (KDTreePartners *this,int dim,int nblocks,bool wrap_,Bounds *domain_)

{
  vector<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  iterator iVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  BoolVector local_168;
  BoolVector local_138;
  Bounds *local_108;
  RegularSwapPartners *local_100;
  RegularAllReducePartners *local_f8;
  long local_f0;
  DivisionsVector local_e8;
  CoordinateVector local_c8;
  DiscreteBounds domain;
  
  Bounds<int>::Bounds(&domain,1);
  *domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin = 0;
  *domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin = nblocks + -1;
  local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = 0;
  local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = 0;
  local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = 0;
  local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = 0;
  local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
            (&this->decomposer,1,&domain,nblocks,&local_138,&local_168,&local_c8,&local_e8);
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ =
         local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_168.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ =
         local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_138.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_f8 = &this->histogram;
  RegularPartners::RegularPartners<diy::RegularDecomposer<diy::Bounds<int>>>
            ((RegularPartners *)local_f8,&this->decomposer,2,true);
  local_100 = &this->swap;
  RegularPartners::RegularPartners<diy::RegularDecomposer<diy::Bounds<int>>>
            (&local_100->super_RegularPartners,&this->decomposer,2,false);
  this_00 = &this->rounds_;
  this_01 = &this->dim_;
  (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->rounds_).super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rounds_).super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rounds_).super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->wrap = wrap_;
  local_108 = &this->domain;
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::small_vector
            ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)local_108,
             (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)domain_,
             (allocator<float> *)&domain);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::small_vector
            (&(this->domain).max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,
             &(domain_->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,
             (allocator<float> *)&domain);
  if ((this->swap).super_RegularPartners.kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->swap).super_RegularPartners.kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      uVar4 = (uint)uVar5;
      if (*(pointer *)
           ((long)&(this->histogram).super_RegularMergePartners.super_RegularPartners.kvs_.
                   super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                   ._M_impl.super__Vector_impl_data + 8) !=
          (this->histogram).super_RegularMergePartners.super_RegularPartners.kvs_.
          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_f0 = (long)(int)~uVar4;
        uVar7 = 0;
        uVar6 = 0;
        do {
          domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ =
               (ulong)uVar6 << 0x20;
          std::vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>>::
          emplace_back<std::pair<bool,int>>
                    ((vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>> *)this_00,
                     (pair<bool,_int> *)&domain);
          iVar3 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                       (long)dim);
          domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ = iVar3;
          iVar1._M_current =
               (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (this_01,iVar1,(int *)&domain);
          }
          else {
            *iVar1._M_current = iVar3;
            (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          uVar2 = (long)*(pointer *)
                         ((long)&(this->histogram).super_RegularMergePartners.super_RegularPartners.
                                 kvs_.
                                 super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                                 ._M_impl.super__Vector_impl_data + 8) -
                  (long)(this->histogram).super_RegularMergePartners.super_RegularPartners.kvs_.
                        super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2;
          iVar3 = 0;
          if ((uVar2 >> 1) + local_f0 == uVar7) {
            iVar3 = uVar4 * 2;
          }
          uVar6 = uVar6 + iVar3 + 1;
          uVar7 = (ulong)(int)uVar6;
        } while (uVar7 < uVar2);
      }
      domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = (uVar5 << 0x20) + 1
      ;
      std::vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>>::
      emplace_back<std::pair<bool,int>>
                ((vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>> *)this_00,
                 (pair<bool,_int> *)&domain);
      iVar3 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                   (long)dim);
      domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ = iVar3;
      iVar1._M_current =
           (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_01,iVar1,(int *)&domain)
        ;
      }
      else {
        *iVar1._M_current = iVar3;
        (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar1._M_current + 1;
      }
      domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = 0xffffffff00000001;
      std::vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>>::
      emplace_back<std::pair<bool,int>>
                ((vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>> *)this_00,
                 (pair<bool,_int> *)&domain);
      iVar1._M_current =
           (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_01,iVar1,(int *)&domain)
        ;
      }
      else {
        *iVar1._M_current = iVar3;
        (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar1._M_current + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->swap).super_RegularPartners.kvs_.
                                   super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->swap).super_RegularPartners.kvs_.
                                   super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

KDTreePartners(int dim, int nblocks, bool wrap_, const Bounds& domain_):
                        decomposer(1, interval(0,nblocks-1), nblocks),
                        histogram(decomposer, 2),
                        swap(decomposer, 2, false),
                        wrap(wrap_),
                        domain(domain_)
  {
    for (int i = 0; i < swap.rounds(); ++i)
    {
      // fill histogram rounds
      for (int j = 0; j < histogram.rounds(); ++j)
      {
        rounds_.push_back(std::make_pair(false, j));
        dim_.push_back(i % dim);
        if (j == histogram.rounds() / 2 - 1 - i)
            j += 2*i;
      }

      // fill swap round
      rounds_.push_back(std::make_pair(true, i));
      dim_.push_back(i % dim);

      // fill link round
      rounds_.push_back(std::make_pair(true, -1));          // (true, -1) signals link round
      dim_.push_back(i % dim);
    }
  }